

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *v)

{
  pointer pRVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar2 = 0;
      pRVar1 = (v->super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(v->
                             super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x150);
      uVar2 = uVar2 + 1) {
    operator<<(os,(Reference *)((long)&(pRVar1->asset_path).asset_path_._M_dataplus + lVar3));
    if (uVar2 != ((long)(v->
                        super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(v->
                       super__Vector_base<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x150 - 1U) {
      std::operator<<(os,", ");
    }
    lVar3 = lVar3 + 0x150;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}